

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O3

int matchone(regex_t p,char c)

{
  int iVar1;
  uint uVar2;
  ushort **ppuVar3;
  bool bVar4;
  
  uVar2 = p._0_4_ & 0xff;
  switch(uVar2) {
  case 1:
    break;
  default:
    bVar4 = (p.u._0_4_ & 0xff) == (int)c;
    goto LAB_001168a3;
  case 8:
    iVar1 = matchcharclass(c,(char *)p.u.ccl);
    return iVar1;
  case 9:
    uVar2 = matchcharclass(c,(char *)p.u.ccl);
    goto LAB_0011683b;
  case 10:
    ppuVar3 = __ctype_b_loc();
    uVar2 = (*ppuVar3)[c] & 0x800;
    break;
  case 0xb:
    ppuVar3 = __ctype_b_loc();
    bVar4 = (*(byte *)((long)*ppuVar3 + (long)c * 2 + 1) & 8) == 0;
    goto LAB_001168a3;
  case 0xc:
    iVar1 = matchalphanum(c);
    return iVar1;
  case 0xd:
    uVar2 = matchalphanum(c);
LAB_0011683b:
    uVar2 = uVar2 ^ 1;
    break;
  case 0xe:
    ppuVar3 = __ctype_b_loc();
    uVar2 = (*ppuVar3)[c] & 0x2000;
    break;
  case 0xf:
    ppuVar3 = __ctype_b_loc();
    bVar4 = (*(byte *)((long)*ppuVar3 + (long)c * 2 + 1) & 0x20) == 0;
LAB_001168a3:
    uVar2 = (uint)bVar4;
  }
  return uVar2;
}

Assistant:

static int matchone(regex_t p, char c)
{
  switch (p.type)
  {
    case DOT:            return matchdot(c);
    case CHAR_CLASS:     return  matchcharclass(c, (const char*)p.u.ccl);
    case INV_CHAR_CLASS: return !matchcharclass(c, (const char*)p.u.ccl);
    case DIGIT:          return  matchdigit(c);
    case NOT_DIGIT:      return !matchdigit(c);
    case ALPHA:          return  matchalphanum(c);
    case NOT_ALPHA:      return !matchalphanum(c);
    case WHITESPACE:     return  matchwhitespace(c);
    case NOT_WHITESPACE: return !matchwhitespace(c);
    default:             return  (p.u.ch == c);
  }
}